

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int seconds_to_hms(int dayseconds,int *hour,int *minute,int *second)

{
  int s;
  int *second_local;
  int *minute_local;
  int *hour_local;
  int dayseconds_local;
  
  if ((dayseconds < 0) || (0x1517f < dayseconds)) {
    coda_set_error(-0x68,"dayseconds argument (%d) is not in the range [0,86400)",
                   (ulong)(uint)dayseconds);
    hour_local._4_4_ = -1;
  }
  else {
    *hour = dayseconds / 0xe10;
    *minute = (dayseconds % 0xe10) / 0x3c;
    *second = (dayseconds % 0xe10) % 0x3c;
    hour_local._4_4_ = 0;
  }
  return hour_local._4_4_;
}

Assistant:

static int seconds_to_hms(int dayseconds, int *hour, int *minute, int *second)
{
    int s = dayseconds;

    if (s < 0 || s > 86399)
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "dayseconds argument (%d) is not in the range [0,86400)", s);
        return -1;
    }

    *hour = s / 3600;
    s %= 3600;
    *minute = s / 60;
    s %= 60;
    *second = s;

    return 0;
}